

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_PitchDetector.cpp
# Opt level: O1

int PitchDetector::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  UnityComplexNumber *data;
  float fVar1;
  uint uVar2;
  float *pfVar3;
  int iVar4;
  float fVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  size_t __n;
  float fVar12;
  float fVar13;
  
  pfVar3 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar3 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = PitchDetector::EffectData]")
    ;
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    uVar2 = (state->field_0).field_0.samplerate;
    fVar1 = pfVar3[7];
    fVar12 = exp2f(pfVar3[6] / 12.0);
    memcpy(outbuffer,inbuffer,(ulong)(inchannels * length) << 2);
    if (length != 0) {
      data = (UnityComplexNumber *)(pfVar3 + 0x400b);
      uVar8 = 0;
      uVar11 = 0;
      do {
        fVar13 = inbuffer[(uint)((int)uVar11 * inchannels)];
        pfVar3[9] = (ABS(fVar13) - pfVar3[9]) * 0.01 + pfVar3[9];
        fVar5 = pfVar3[8];
        pfVar3[(long)(int)fVar5 + 0xc0b] = fVar13;
        fVar5 = (float)((int)fVar5 + 1);
        pfVar3[8] = fVar5;
        if (fVar5 == 1.43493e-42) {
          pfVar3[8] = 0.0;
          memmove(pfVar3 + 0xb,pfVar3 + 0x40b,0x3000);
          lVar6 = 0x2006;
          do {
            pfVar3[lVar6 * 2 + -1] = pfVar3[lVar6 + -0x1ffb] * pfVar3[lVar6 + -0xffb];
            pfVar3[lVar6 * 2] = 0.0;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x3006);
          memset(pfVar3 + 0x600b,0,0x8000);
          FFT::Forward(data,0x2000,true);
          fVar13 = pfVar3[1];
          fVar5 = pfVar3[2];
          __n = (long)(int)fVar13 * 8;
          memset(data,0,__n);
          memset(data + (int)fVar5,0,(long)((int)fVar5 * -2 + 0x2000) << 3);
          memset(pfVar3 + (long)(int)fVar13 * -2 + 0x800b,0,__n);
          lVar6 = 0;
          do {
            fVar13 = *(float *)((long)pfVar3 + lVar6 * 2 + 0x1002c);
            fVar5 = *(float *)((long)pfVar3 + lVar6 * 2 + 0x10030);
            fVar13 = (fVar13 * fVar13 + fVar5 * fVar5) * pfVar3[uVar11 + 0x200b];
            *(float *)((long)pfVar3 + lVar6 * 2 + 0x1002c) = fVar13;
            *(undefined4 *)((long)pfVar3 + lVar6 * 2 + 0x10030) = 0;
            *(float *)((long)&debugdata + lVar6) = fVar13;
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0x8000);
          FFT::Backward(data,0x2000,true);
          iVar9 = (int)pfVar3[3];
          iVar10 = 0;
          if (iVar9 < (int)pfVar3[4]) {
            lVar6 = 0;
            fVar13 = 0.0;
            iVar10 = 0;
            do {
              fVar5 = data[iVar9 + lVar6].re;
              iVar4 = iVar9 + (int)lVar6;
              if (data[iVar9 + lVar6].re <= fVar13) {
                fVar5 = fVar13;
                iVar4 = iVar10;
              }
              iVar10 = iVar4;
              fVar13 = fVar5;
              lVar6 = lVar6 + 1;
            } while ((long)(int)pfVar3[4] - (long)iVar9 != lVar6);
          }
          if ((pfVar3[5] <= pfVar3[9] && pfVar3[9] != pfVar3[5]) && (0 < iVar10)) {
            *(float *)(detected_freqs + (long)(int)*pfVar3 * 4) =
                 (float)(state->field_0).field_0.samplerate / (float)iVar10;
          }
        }
        fVar13 = *(float *)(detected_freqs + (long)(int)*pfVar3 * 4) * (1.0 / (float)uVar2) * fVar12
                 + pfVar3[10];
        fVar5 = floorf(fVar13);
        pfVar3[10] = fVar13 - (float)(int)fVar5;
        iVar10 = (int)uVar8;
        uVar7 = (ulong)(uint)outchannels;
        if (0 < outchannels) {
          do {
            outbuffer[uVar8] =
                 ((pfVar3[10] + pfVar3[10] + -1.0) * pfVar3[9] - outbuffer[uVar8]) * fVar1 +
                 outbuffer[uVar8];
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        uVar11 = uVar11 + 1;
        uVar8 = (ulong)(uint)(iVar10 + outchannels);
      } while (uVar11 != length);
    }
    return 0;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = PitchDetector::EffectData]");
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        const float sampletime = 1.0f / state->samplerate;
        const float monitor = data->p[P_MONITOR];
        const float oscpitch = powf(2.0f, data->p[P_OSCPITCH] / 12.0f) * sampletime;

        memcpy(outbuffer, inbuffer, length * inchannels * sizeof(float));

        for (unsigned int n = 0; n < length; n++)
        {
            float input = inbuffer[n * inchannels];

            data->env += (fabsf(input) - data->env) * 0.01f;
            data->buffer[data->counter + WINSIZE - HOPSIZE] = input;

            if (++data->counter == HOPSIZE)
            {
                data->counter = 0;

                for (int i = 0; i < WINSIZE - HOPSIZE; i++)
                    data->buffer[i] = data->buffer[i + HOPSIZE];

                for (int i = 0; i < WINSIZE; i++)
                {
                    data->spec[i].re = data->buffer[i] * data->window[i];
                    data->spec[i].im = 0.0f;
                }

                for (int i = WINSIZE; i < FFTSIZE; i++)
                {
                    data->spec[i].re = 0.0f;
                    data->spec[i].im = 0.0f;
                }

                FFT::Forward(data->spec, FFTSIZE, true);

                int locut = (int)data->p[P_LOCUT];
                int hicut = (int)data->p[P_HICUT];
                memset(data->spec, 0, sizeof(UnityComplexNumber) * locut);
                memset(data->spec + hicut, 0, sizeof(UnityComplexNumber) * (FFTSIZE - 2 * hicut));
                memset(data->spec + FFTSIZE - locut, 0, sizeof(UnityComplexNumber) * locut);

                // Fast autocorrelation
                for (int i = 0; i < FFTSIZE; i++)
                {
                    data->spec[i].re = data->spec[i].Magnitude2() * data->acnf[n]; // Correct for windowing
                    data->spec[i].im = 0.0f;
                    debugdata[i] = data->spec[i].re;
                }
                FFT::Backward(data->spec, FFTSIZE, true);

                int startbin = (int)data->p[P_LOBIN];
                int endbin = (int)data->p[P_HIBIN];
                int maxbin = 0;
                float maxval = 0.0f;
                for (int n = startbin; n < endbin; n++)
                {
                    float a = data->spec[n].re;
                    if (a > maxval)
                    {
                        maxbin = n;
                        maxval = a;
                    }
                }

                if (data->env > data->p[P_THR] && maxbin > 0)
                    detected_freqs[(int)data->p[P_INDEX]] = (float)state->samplerate / (float)maxbin;
            }

            data->phase += detected_freqs[(int)data->p[P_INDEX]] * oscpitch;
            data->phase -= FastFloor(data->phase);

            for (int c = 0; c < outchannels; c++)
                outbuffer[n * outchannels + c] += ((data->phase * 2.0f - 1.0f) * data->env - outbuffer[n * outchannels + c]) * monitor;
        }

        return UNITY_AUDIODSP_OK;
    }